

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ServerList.cpp
# Opt level: O3

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
* parse_query_string_abi_cxx11_
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
             *__return_storage_ptr__,string_view in_query_string)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *inout_string;
  
  (__return_storage_ptr__->first)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->first).field_2;
  (__return_storage_ptr__->first)._M_string_length = 0;
  (__return_storage_ptr__->first).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)&(__return_storage_ptr__->second)._M_h._M_rehash_policy = 0;
  (__return_storage_ptr__->second)._M_h._M_buckets =
       &(__return_storage_ptr__->second)._M_h._M_single_bucket;
  (__return_storage_ptr__->second)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->second)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->second)._M_h._M_element_count = 0;
  (__return_storage_ptr__->second)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->second)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->second)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&__return_storage_ptr__->first,0,0,in_query_string._M_str,in_query_string._M_len);
  jessilib::
  deserialize_html_form<char,_std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_nullptr>
            ((jessilib *)&__return_storage_ptr__->second,
             (unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              *)__return_storage_ptr__,inout_string);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, query_table_type> parse_query_string(std::string_view in_query_string) {
	std::pair<std::string, query_table_type> result;
	result.first = in_query_string;
	jessilib::deserialize_html_form(result.second, result.first);
	return result;
}